

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  int iVar1;
  string_view_t a_logger_name;
  source_loc loc;
  bool traceback_enabled;
  size_t in_RCX;
  char *in_RDX;
  level_enum in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar3;
  string_view_t msg;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  char *in_stack_00000018;
  log_msg log_msg;
  log_msg local_90;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  uVar2 = extraout_XMM0_Da;
  uVar3 = extraout_XMM0_Db;
  if (iVar1 <= (int)in_ESI || traceback_enabled) {
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    loc._8_8_ = in_stack_00000010;
    loc.filename = (char *)in_stack_00000008;
    loc.funcname = in_stack_00000018;
    msg.size_ = in_RCX;
    msg.data_ = in_RDX;
    details::log_msg::log_msg(&local_90,loc,a_logger_name,in_ESI,msg);
    log_it_(this,&local_90,iVar1 <= (int)in_ESI,traceback_enabled);
    uVar2 = extraout_XMM0_Da_00;
    uVar3 = extraout_XMM0_Db_00;
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }